

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

Upvaldesc * allocupvalue(FuncState *fs)

{
  byte bVar1;
  int iVar2;
  Proto *pPVar3;
  Upvaldesc *pUVar4;
  long lVar5;
  Upvaldesc *pUVar6;
  
  if (fs->nups != 0xff) {
    pPVar3 = fs->f;
    iVar2 = pPVar3->sizeupvalues;
    pUVar4 = (Upvaldesc *)
             luaM_growaux_(fs->ls->L,pPVar3->upvalues,(uint)fs->nups,&pPVar3->sizeupvalues,0x10,0xff
                           ,"upvalues");
    pPVar3->upvalues = pUVar4;
    if (iVar2 < pPVar3->sizeupvalues) {
      lVar5 = (long)pPVar3->sizeupvalues - (long)iVar2;
      pUVar6 = pUVar4 + iVar2;
      do {
        pUVar6->name = (TString *)0x0;
        pUVar6 = pUVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    bVar1 = fs->nups;
    fs->nups = bVar1 + 1;
    return pUVar4 + bVar1;
  }
  errorlimit(fs,0xff,"upvalues");
}

Assistant:

static Upvaldesc *allocupvalue (FuncState *fs) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  return &f->upvalues[fs->nups++];
}